

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O1

void __thiscall
mxx::custom_op<double>::custom_op<std::multiplies<double>>
          (custom_op<double> *this,undefined1 param_2)

{
  datatype dt;
  datatype local_40;
  int local_24;
  
  this->_vptr_custom_op = (_func_int **)&PTR__custom_op_0014bd70;
  *(undefined8 *)&(this->m_user_func).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_user_func).super__Function_base._M_functor + 8) = 0;
  (this->m_user_func).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_user_func)._M_invoker = (_Invoker_type)0x0;
  this->m_builtin = false;
  this->m_builtin = true;
  this->m_op = (MPI_Op)&ompi_mpi_op_prod;
  local_40._vptr_datatype = (_func_int **)&PTR__datatype_0014bce8;
  local_40.mpitype = (MPI_Datatype)&ompi_mpi_double;
  local_40.builtin = true;
  this->m_type_copy = (MPI_Datatype)&ompi_mpi_double;
  datatype::~datatype(&local_40);
  if (this->m_builtin == false) {
    local_40._vptr_datatype = (_func_int **)custom_function<std::multiplies<double>>;
    std::function<void(void*,void*,int*,ompi_datatype_t**)>::operator=
              ((function<void(void*,void*,int*,ompi_datatype_t**)> *)&this->m_user_func,
               (_Bind<void_(*(std::multiplies<double>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(std::multiplies<double>,_void_*,_void_*,_int_*,_ompi_datatype_t_**)>
                *)&local_40);
    local_40._vptr_datatype = (_func_int **)&PTR__datatype_0014bce8;
    local_40.mpitype = (MPI_Datatype)&ompi_mpi_double;
    local_40.builtin = true;
    MPI_Type_dup(&ompi_mpi_double,&this->m_type_copy);
    local_24 = 0x543;
    attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::set
              (&this->m_type_copy,&local_24,&this->m_user_func);
    MPI_Op_create(mpi_user_function,param_2,&this->m_op);
    datatype::~datatype(&local_40);
  }
  return;
}

Assistant:

custom_op(Func func, const bool commutative = true) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            namespace ph = std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                   std::forward<Func>(func),
                                   ph::_1, ph::_2, ph::_3, ph::_4);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, commutative, &m_op);
        }
    }